

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O3

char * __thiscall
cmCommandArgumentParserHelper::AddString(cmCommandArgumentParserHelper *this,string *str)

{
  pointer *pppcVar1;
  iterator __position;
  cmCommandArgumentParserHelper *__dest;
  char *stVal;
  cmCommandArgumentParserHelper *local_20;
  
  __dest = this;
  if (str->_M_string_length != 0) {
    __dest = (cmCommandArgumentParserHelper *)operator_new__(str->_M_string_length + 1);
    local_20 = __dest;
    strcpy((char *)__dest,(str->_M_dataplus)._M_p);
    __position._M_current =
         (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                ((vector<char*,std::allocator<char*>> *)&this->Variables,__position,
                 (char **)&local_20);
      __dest = local_20;
    }
    else {
      *__position._M_current = (char *)__dest;
      pppcVar1 = &(this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  return __dest->EmptyVariable;
}

Assistant:

char* cmCommandArgumentParserHelper::AddString(const std::string& str)
{
  if ( str.empty() )
    {
    return this->EmptyVariable;
    }
  char* stVal = new char[str.size()+1];
  strcpy(stVal, str.c_str());
  this->Variables.push_back(stVal);
  return stVal;
}